

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TmpFile.h
# Opt level: O1

void __thiscall TmpFile::TmpFile(TmpFile *this)

{
  long *plVar1;
  int i;
  int iVar2;
  ofstream file;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  generateTmpname_abi_cxx11_();
  std::ofstream::ofstream(&local_228,(string *)this,_S_out);
  iVar2 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"This is line #",0xe);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&local_228,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    iVar2 = iVar2 + 1;
  } while (iVar2 != 1000);
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___cxa_allocate_exception;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

TmpFile() {
        std::ofstream file(name_);
        for(int i = 0; i < 1000; i++) {
            file << "This is line #" << i << std::endl;
        }
    }